

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O2

Address * __thiscall
cfd::AddressFactory::GetAddressByHash
          (Address *__return_storage_ptr__,AddressFactory *this,AddressType address_type,
          ByteData *hash)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  core::ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,hash);
  core::ByteData160::ByteData160
            ((ByteData160 *)&local_50,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  GetAddressByHash(__return_storage_ptr__,this,address_type,(ByteData160 *)&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Address AddressFactory::GetAddressByHash(
    AddressType address_type, const ByteData& hash) const {
  return GetAddressByHash(address_type, ByteData160(hash.GetBytes()));
}